

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view source,
          OutputFormat output)

{
  string_view sVar1;
  string local_c8;
  string_view local_a8;
  string local_98;
  cmOutputConverter *local_78;
  size_t sStack_70;
  string local_60;
  allocator<char> local_2e;
  undefined1 local_2d;
  OutputFormat local_2c;
  cmOutputConverter *pcStack_28;
  OutputFormat output_local;
  cmOutputConverter *this_local;
  string_view source_local;
  string *result;
  
  source_local._M_len = (size_t)source._M_str;
  this_local = (cmOutputConverter *)source._M_len;
  local_2d = 0;
  local_2c = output;
  pcStack_28 = this;
  source_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_2e);
  std::allocator<char>::~allocator(&local_2e);
  if (((local_2c == SHELL) || (local_2c == WATCOMQUOTE)) || (local_2c == NINJAMULTI)) {
    local_78 = this_local;
    sStack_70 = source_local._M_len;
    sVar1._M_str = (char *)source_local._M_len;
    sVar1._M_len = (size_t)this_local;
    ConvertDirectorySeparatorsForShell_abi_cxx11_(&local_60,this,sVar1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    local_a8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)__return_storage_ptr__);
    EscapeForShell_abi_cxx11_
              (&local_98,this,local_a8,true,false,local_2c == WATCOMQUOTE,local_2c == NINJAMULTI,
               false);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else if (local_2c == RESPONSE) {
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)__return_storage_ptr__);
    EscapeForShell_abi_cxx11_(&local_c8,this,sVar1,false,false,false,false,true);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToOutputFormat(cm::string_view source,
                                                     OutputFormat output) const
{
  std::string result(source);
  // Convert it to an output path.
  if (output == SHELL || output == WATCOMQUOTE || output == NINJAMULTI) {
    result = this->ConvertDirectorySeparatorsForShell(source);
    result = this->EscapeForShell(result, true, false, output == WATCOMQUOTE,
                                  output == NINJAMULTI);
  } else if (output == RESPONSE) {
    result = this->EscapeForShell(result, false, false, false, false, true);
  }
  return result;
}